

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> *
spvOpcodeMemorySemanticsOperandIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Op opcode)

{
  pointer puVar1;
  pointer puVar2;
  
  if ((int)opcode < 0x13e) {
    switch(opcode) {
    case OpControlBarrier:
    case OpAtomicStore:
      goto switchD_0062092f_caseD_e0;
    case OpMemoryBarrier:
      puVar1 = (pointer)operator_new(4);
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar1;
      puVar2 = puVar1 + 1;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
      *puVar1 = 1;
      break;
    default:
switchD_0062092f_caseD_e2:
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return __return_storage_ptr__;
    case OpAtomicLoad:
    case OpAtomicExchange:
    case OpAtomicIIncrement:
    case OpAtomicIDecrement:
    case OpAtomicIAdd:
    case OpAtomicISub:
    case OpAtomicSMin:
    case OpAtomicUMin:
    case OpAtomicSMax:
    case OpAtomicUMax:
    case OpAtomicAnd:
    case OpAtomicOr:
    case OpAtomicXor:
      goto switchD_0062092f_caseD_e3;
    case OpAtomicCompareExchange:
    case OpAtomicCompareExchangeWeak:
      puVar1 = (pointer)operator_new(8);
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar1;
      puVar2 = puVar1 + 2;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
      puVar1[0] = 4;
      puVar1[1] = 5;
    }
    goto LAB_006209e7;
  }
  if ((int)opcode < 0x149) {
    if (opcode == OpAtomicFlagTestAndSet) {
switchD_0062092f_caseD_e3:
      puVar1 = (pointer)operator_new(4);
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = puVar1;
      puVar2 = puVar1 + 1;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
      *puVar1 = 4;
      goto LAB_006209e7;
    }
    if (opcode != OpAtomicFlagClear) goto switchD_0062092f_caseD_e2;
  }
  else if (opcode != OpMemoryNamedBarrier) {
    if (opcode != OpAtomicFAddEXT) goto switchD_0062092f_caseD_e2;
    goto switchD_0062092f_caseD_e3;
  }
switchD_0062092f_caseD_e0:
  puVar1 = (pointer)operator_new(4);
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  puVar2 = puVar1 + 1;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar2;
  *puVar1 = 2;
LAB_006209e7:
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = puVar2;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> spvOpcodeMemorySemanticsOperandIndices(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpMemoryBarrier:
      return {1};
    case spv::Op::OpAtomicStore:
    case spv::Op::OpControlBarrier:
    case spv::Op::OpAtomicFlagClear:
    case spv::Op::OpMemoryNamedBarrier:
      return {2};
    case spv::Op::OpAtomicLoad:
    case spv::Op::OpAtomicExchange:
    case spv::Op::OpAtomicIIncrement:
    case spv::Op::OpAtomicIDecrement:
    case spv::Op::OpAtomicIAdd:
    case spv::Op::OpAtomicFAddEXT:
    case spv::Op::OpAtomicISub:
    case spv::Op::OpAtomicSMin:
    case spv::Op::OpAtomicUMin:
    case spv::Op::OpAtomicSMax:
    case spv::Op::OpAtomicUMax:
    case spv::Op::OpAtomicAnd:
    case spv::Op::OpAtomicOr:
    case spv::Op::OpAtomicXor:
    case spv::Op::OpAtomicFlagTestAndSet:
      return {4};
    case spv::Op::OpAtomicCompareExchange:
    case spv::Op::OpAtomicCompareExchangeWeak:
      return {4, 5};
    default:
      return {};
  }
}